

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O0

err_t dstuPointVal(dstu_params *params,octet *point)

{
  bool_t bVar1;
  octet *in_RSI;
  void *stack;
  word *y;
  word *x;
  ec_o *ec;
  err_t code;
  dstu_deep_i in_stack_00000048;
  dstu_params *in_stack_00000050;
  ec_o **in_stack_00000058;
  size_t *stack_00;
  size_t *stack_01;
  ec_o *ec_00;
  ec_o *ec_01;
  undefined4 in_stack_ffffffffffffffe0;
  err_t local_4;
  
  ec_01 = (ec_o *)0x0;
  local_4 = dstuEcCreate(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  if (local_4 == 0) {
    bVar1 = memIsValid(in_RSI,ec_01->f->no << 1);
    if (bVar1 == 0) {
      dstuEcClose((ec_o *)0x16489e);
      local_4 = 0x6d;
    }
    else {
      ec_00 = (ec_o *)((long)&(ec_01->hdr).keep + (ec_01->hdr).keep);
      stack_01 = &(ec_00->hdr).keep + ec_01->f->n;
      stack_00 = stack_01 + ec_01->f->n;
      bVar1 = (*ec_01->f->from)((word *)ec_00,in_RSI,ec_01->f,stack_00);
      if ((((bVar1 == 0) ||
           (bVar1 = (*ec_01->f->from)(stack_01,in_RSI + ec_01->f->no,ec_01->f,stack_00), bVar1 == 0)
           ) || (bVar1 = ec2IsOnA((word *)ec_01,ec_00,stack_01), bVar1 == 0)) ||
         (bVar1 = ecHasOrderA((word *)CONCAT44(local_4,in_stack_ffffffffffffffe0),ec_01,
                              (word *)ec_00,(size_t)stack_01,stack_00), bVar1 == 0)) {
        local_4 = 0x191;
      }
      dstuEcClose((ec_o *)0x1649bc);
    }
  }
  return local_4;
}

Assistant:

err_t dstuPointVal(const dstu_params* params, const octet point[])
{
	err_t code;
	// состояние
	ec_o* ec = 0;
	word* x;
	word* y;
	void* stack;
	// старт
	code = dstuEcCreate(&ec, params, dstuPointVal_deep);
	ERR_CALL_CHECK(code);
	// проверить входные указатели
	if (!memIsValid(point, 2 * ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	x = objEnd(ec, word);
	y = x + ec->f->n;
	stack = y + ec->f->n;
	// (x, y) лежит на ЭК? (x, y) имеет порядок order?
	if (!qrFrom(x, point, ec->f, stack) ||
		!qrFrom(y, point + ec->f->no, ec->f, stack) ||
		!ec2IsOnA(x, ec, stack) ||
		!ecHasOrderA(x, ec, ec->order, ec->f->n, stack))
		code = ERR_BAD_POINT;
	// завершение
	dstuEcClose(ec);
	return code;
}